

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall
FirewirePort::WriteQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar param_4)

{
  int iVar1;
  nodeid_t curNode;
  ushort uVar2;
  bool bVar3;
  allocator<char> local_55;
  uint local_54;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"FirewirePort::WriteQuadlet",&local_55);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
  std::__cxx11::string::~string(local_50);
  if ((char)iVar1 == '\0') {
    bVar3 = false;
  }
  else {
    local_54 = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    iVar1 = raw1394_write(this->handle,this->baseNodeId + node,addr,4);
    bVar3 = iVar1 == 0;
    if (node == 0x3f && !bVar3) {
      bVar3 = true;
      for (uVar2 = 0; (uint)uVar2 < (this->super_BasePort).NumOfNodes_; uVar2 = uVar2 + 1) {
        iVar1 = raw1394_write(this->handle,uVar2 + this->baseNodeId,addr,4,&local_54);
        bVar3 = (bool)(bVar3 & iVar1 == 0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool FirewirePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::WriteQuadlet"))
        return false;

    data = bswap_32(data);
    bool ret = !raw1394_write(handle, baseNodeId+node, addr, 4, &data);

    // Workaround for Firewire broadcast, which is not currently working due to an issue with
    // either libraw1394 or the Firewire JuJu driver.
    if (!ret && (node == FW_NODE_BROADCAST)) {
        ret = true;
        for (nodeid_t curNode = 0; curNode < NumOfNodes_; curNode++) {
            if (raw1394_write(handle, baseNodeId+curNode, addr, 4, &data))
                ret = false;
        }
    }

    return ret;
}